

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_v4dwt_decode_step2_sse
               (opj_v4_t *l,opj_v4_t *w,OPJ_UINT32 start,OPJ_UINT32 end,OPJ_UINT32 m,__m128 c)

{
  undefined8 uVar1;
  undefined8 uVar2;
  OPJ_UINT32 OVar3;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  __m128 tmp9;
  __m128 tmp8;
  __m128 tmp7;
  __m128 tmp6;
  __m128 tmp5;
  __m128 tmp4;
  __m128 tmp3;
  __m128 tmp2;
  __m128 tmp1;
  OPJ_UINT32 local_28c;
  OPJ_UINT32 imax;
  OPJ_UINT32 i;
  __m128 *vw;
  __m128 *vl;
  __m128 c_local;
  OPJ_UINT32 m_local;
  OPJ_UINT32 end_local;
  OPJ_UINT32 start_local;
  opj_v4_t *w_local;
  opj_v4_t *l_local;
  float fStack_240;
  float fStack_23c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  OVar3 = opj_uint_min(end,m);
  local_28c = start;
  if (start == 0) {
    tmp2._8_8_ = *(undefined8 *)l;
    tmp1._0_8_ = *(undefined8 *)(l->f + 2);
    _imax = w;
  }
  else {
    _imax = w + (start << 1);
    tmp2._8_8_ = *(undefined8 *)(_imax + -3);
    tmp1._0_8_ = *(undefined8 *)((long)_imax + -0x28);
  }
  for (; local_28c + 3 < OVar3; local_28c = local_28c + 4) {
    uVar1 = *(undefined8 *)(_imax + 6);
    uVar2 = *(undefined8 *)((long)_imax + 0x68);
    local_18 = (float)tmp2._8_8_;
    fStack_14 = SUB84(tmp2._8_8_,4);
    fStack_10 = (float)tmp1._0_8_;
    fStack_c = SUB84(tmp1._0_8_,4);
    local_28 = (float)*(undefined8 *)_imax;
    fStack_24 = (float)((ulong)*(undefined8 *)_imax >> 0x20);
    fStack_20 = (float)*(undefined8 *)(_imax->f + 2);
    fStack_1c = (float)((ulong)*(undefined8 *)(_imax->f + 2) >> 0x20);
    local_38 = (float)*(undefined8 *)(_imax + -1);
    fStack_34 = (float)((ulong)*(undefined8 *)(_imax + -1) >> 0x20);
    fStack_30 = (float)*(undefined8 *)((long)_imax + -8);
    fStack_2c = (float)((ulong)*(undefined8 *)((long)_imax + -8) >> 0x20);
    _imax[-1].f[0] = (OPJ_FLOAT32)(local_38 + (local_18 + local_28) * c[0]);
    *(float *)((long)_imax + -0xc) = fStack_34 + (fStack_14 + fStack_24) * c[1];
    *(float *)((long)_imax + -8) = fStack_30 + (fStack_10 + fStack_20) * in_XMM0_Dc;
    *(float *)((long)_imax + -4) = fStack_2c + (fStack_c + fStack_1c) * in_XMM0_Dd;
    local_68 = (float)*(undefined8 *)(_imax + 2);
    fStack_64 = (float)((ulong)*(undefined8 *)(_imax + 2) >> 0x20);
    fStack_60 = (float)*(undefined8 *)((long)_imax + 0x28);
    fStack_5c = (float)((ulong)*(undefined8 *)((long)_imax + 0x28) >> 0x20);
    local_78 = (float)*(undefined8 *)(_imax + 1);
    fStack_74 = (float)((ulong)*(undefined8 *)(_imax + 1) >> 0x20);
    fStack_70 = (float)*(undefined8 *)((long)_imax + 0x18);
    fStack_6c = (float)((ulong)*(undefined8 *)((long)_imax + 0x18) >> 0x20);
    _imax[1].f[0] = (OPJ_FLOAT32)(local_78 + (local_28 + local_68) * c[0]);
    *(float *)((long)_imax + 0x14) = fStack_74 + (fStack_24 + fStack_64) * c[1];
    *(float *)((long)_imax + 0x18) = fStack_70 + (fStack_20 + fStack_60) * in_XMM0_Dc;
    *(float *)((long)_imax + 0x1c) = fStack_6c + (fStack_1c + fStack_5c) * in_XMM0_Dd;
    local_a8 = (float)*(undefined8 *)(_imax + 4);
    fStack_a4 = (float)((ulong)*(undefined8 *)(_imax + 4) >> 0x20);
    fStack_a0 = (float)*(undefined8 *)((long)_imax + 0x48);
    fStack_9c = (float)((ulong)*(undefined8 *)((long)_imax + 0x48) >> 0x20);
    local_b8 = (float)*(undefined8 *)(_imax + 3);
    fStack_b4 = (float)((ulong)*(undefined8 *)(_imax + 3) >> 0x20);
    fStack_b0 = (float)*(undefined8 *)((long)_imax + 0x38);
    fStack_ac = (float)((ulong)*(undefined8 *)((long)_imax + 0x38) >> 0x20);
    _imax[3].f[0] = (OPJ_FLOAT32)(local_b8 + (local_68 + local_a8) * c[0]);
    *(float *)((long)_imax + 0x34) = fStack_b4 + (fStack_64 + fStack_a4) * c[1];
    *(float *)((long)_imax + 0x38) = fStack_b0 + (fStack_60 + fStack_a0) * in_XMM0_Dc;
    *(float *)((long)_imax + 0x3c) = fStack_ac + (fStack_5c + fStack_9c) * in_XMM0_Dd;
    local_e8 = (float)uVar1;
    fStack_e4 = SUB84(uVar1,4);
    fStack_e0 = (float)uVar2;
    fStack_dc = SUB84(uVar2,4);
    local_f8 = (float)*(undefined8 *)(_imax + 5);
    fStack_f4 = (float)((ulong)*(undefined8 *)(_imax + 5) >> 0x20);
    fStack_f0 = (float)*(undefined8 *)((long)_imax + 0x58);
    fStack_ec = (float)((ulong)*(undefined8 *)((long)_imax + 0x58) >> 0x20);
    _imax[5].f[0] = (OPJ_FLOAT32)(local_f8 + (local_a8 + local_e8) * c[0]);
    *(float *)((long)_imax + 0x54) = fStack_f4 + (fStack_a4 + fStack_e4) * c[1];
    *(float *)((long)_imax + 0x58) = fStack_f0 + (fStack_a0 + fStack_e0) * in_XMM0_Dc;
    *(float *)((long)_imax + 0x5c) = fStack_ec + (fStack_9c + fStack_dc) * in_XMM0_Dd;
    _imax = _imax + 8;
    tmp2._8_8_ = uVar1;
    tmp1._0_8_ = uVar2;
  }
  for (; local_28c < OVar3; local_28c = local_28c + 1) {
    uVar1 = *(undefined8 *)_imax;
    uVar2 = *(undefined8 *)(_imax->f + 2);
    local_118 = (float)tmp2._8_8_;
    fStack_114 = SUB84(tmp2._8_8_,4);
    fStack_110 = (float)tmp1._0_8_;
    fStack_10c = SUB84(tmp1._0_8_,4);
    local_128 = (float)uVar1;
    fStack_124 = SUB84(uVar1,4);
    fStack_120 = (float)uVar2;
    fStack_11c = SUB84(uVar2,4);
    local_138 = (float)*(undefined8 *)(_imax + -1);
    fStack_134 = (float)((ulong)*(undefined8 *)(_imax + -1) >> 0x20);
    fStack_130 = (float)*(undefined8 *)((long)_imax + -8);
    fStack_12c = (float)((ulong)*(undefined8 *)((long)_imax + -8) >> 0x20);
    _imax[-1].f[0] = (OPJ_FLOAT32)(local_138 + (local_118 + local_128) * c[0]);
    *(float *)((long)_imax + -0xc) = fStack_134 + (fStack_114 + fStack_124) * c[1];
    *(float *)((long)_imax + -8) = fStack_130 + (fStack_110 + fStack_120) * in_XMM0_Dc;
    *(float *)((long)_imax + -4) = fStack_12c + (fStack_10c + fStack_11c) * in_XMM0_Dd;
    _imax = _imax + 2;
    tmp2._8_8_ = uVar1;
    tmp1._0_8_ = uVar2;
  }
  if (m < end) {
    if (m + 1 != end) {
      __assert_fail("m + 1 == end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/dwt.c"
                    ,0x93f,
                    "void opj_v4dwt_decode_step2_sse(opj_v4_t *, opj_v4_t *, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, __m128)"
                   );
    }
    l_local._0_4_ = (float)*(undefined8 *)(_imax + -2);
    l_local._4_4_ = (float)((ulong)*(undefined8 *)(_imax + -2) >> 0x20);
    fStack_240 = (float)*(undefined8 *)((long)_imax + -0x18);
    fStack_23c = (float)((ulong)*(undefined8 *)((long)_imax + -0x18) >> 0x20);
    local_178 = (float)*(undefined8 *)(_imax + -1);
    fStack_174 = (float)((ulong)*(undefined8 *)(_imax + -1) >> 0x20);
    fStack_170 = (float)*(undefined8 *)((long)_imax + -8);
    fStack_16c = (float)((ulong)*(undefined8 *)((long)_imax + -8) >> 0x20);
    _imax[-1].f[0] = (OPJ_FLOAT32)(local_178 + (c[0] + c[0]) * l_local._0_4_);
    *(float *)((long)_imax + -0xc) = fStack_174 + (c[1] + c[1]) * l_local._4_4_;
    *(float *)((long)_imax + -8) = fStack_170 + (in_XMM0_Dc + in_XMM0_Dc) * fStack_240;
    *(float *)((long)_imax + -4) = fStack_16c + (in_XMM0_Dd + in_XMM0_Dd) * fStack_23c;
  }
  return;
}

Assistant:

static void opj_v4dwt_decode_step2_sse(opj_v4_t* l, opj_v4_t* w,
                                       OPJ_UINT32 start,
                                       OPJ_UINT32 end,
                                       OPJ_UINT32 m,
                                       __m128 c)
{
    __m128* OPJ_RESTRICT vl = (__m128*) l;
    __m128* OPJ_RESTRICT vw = (__m128*) w;
    OPJ_UINT32 i;
    OPJ_UINT32 imax = opj_uint_min(end, m);
    __m128 tmp1, tmp2, tmp3;
    if (start == 0) {
        tmp1 = vl[0];
    } else {
        vw += start * 2;
        tmp1 = vw[-3];
    }

    i = start;

    /* 4x loop unrolling */
    for (; i + 3 < imax; i += 4) {
        __m128 tmp4, tmp5, tmp6, tmp7, tmp8, tmp9;
        tmp2 = vw[-1];
        tmp3 = vw[ 0];
        tmp4 = vw[ 1];
        tmp5 = vw[ 2];
        tmp6 = vw[ 3];
        tmp7 = vw[ 4];
        tmp8 = vw[ 5];
        tmp9 = vw[ 6];
        vw[-1] = _mm_add_ps(tmp2, _mm_mul_ps(_mm_add_ps(tmp1, tmp3), c));
        vw[ 1] = _mm_add_ps(tmp4, _mm_mul_ps(_mm_add_ps(tmp3, tmp5), c));
        vw[ 3] = _mm_add_ps(tmp6, _mm_mul_ps(_mm_add_ps(tmp5, tmp7), c));
        vw[ 5] = _mm_add_ps(tmp8, _mm_mul_ps(_mm_add_ps(tmp7, tmp9), c));
        tmp1 = tmp9;
        vw += 8;
    }

    for (; i < imax; ++i) {
        tmp2 = vw[-1];
        tmp3 = vw[ 0];
        vw[-1] = _mm_add_ps(tmp2, _mm_mul_ps(_mm_add_ps(tmp1, tmp3), c));
        tmp1 = tmp3;
        vw += 2;
    }
    if (m < end) {
        assert(m + 1 == end);
        c = _mm_add_ps(c, c);
        c = _mm_mul_ps(c, vw[-2]);
        vw[-1] = _mm_add_ps(vw[-1], c);
    }
}